

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMimeMagicRule>::reallocateAndGrow
          (QArrayDataPointer<QMimeMagicRule> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QMimeMagicRule> *old)

{
  long lVar1;
  bool bVar2;
  QMimeMagicRule *pQVar3;
  QGenericArrayOps<QMimeMagicRule> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QMimeMagicRule> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QMimeMagicRule> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QMimeMagicRule *in_stack_ffffffffffffff70;
  QMimeMagicRule *in_stack_ffffffffffffff78;
  QGenericArrayOps<QMimeMagicRule> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QMimeMagicRule> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff70), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QMimeMagicRule> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QMimeMagicRule> *)&stack0xffffffffffffffe0),
       pQVar3 == (QMimeMagicRule *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_008f7518;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QMimeMagicRule> *)
                  operator->((QArrayDataPointer<QMimeMagicRule> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QMimeMagicRule> *)0x8f7417);
        begin((QArrayDataPointer<QMimeMagicRule> *)0x8f7426);
        QtPrivate::QGenericArrayOps<QMimeMagicRule>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QMimeMagicRule *)
             operator->((QArrayDataPointer<QMimeMagicRule> *)&stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QMimeMagicRule> *)0x8f7468);
        begin((QArrayDataPointer<QMimeMagicRule> *)0x8f7477);
        QtPrivate::QGenericArrayOps<QMimeMagicRule>::moveAppend
                  (in_stack_ffffffffffffff80,pQVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<QMimeMagicRule> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<QMimeMagicRule> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QMimeMagicRule> *)in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QMimeMagicRule>::reallocate
              ((QMovableArrayOps<QMimeMagicRule> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_008f7518:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }